

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O0

bool __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>,pico_tree::max_leaf_size_t,pico_tree::median_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>>
::is_leaf<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::median_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>_>
           *this,index_type depth,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  difference_type dVar1;
  undefined4 in_ESI;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  
  dVar1 = __gnu_cxx::operator-
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_RDI);
  return dVar1 <= *(int *)&in_RDI[1]._M_current;
}

Assistant:

inline bool is_leaf(
      index_type depth,
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end) const {
    if constexpr (std::is_same_v<Stop_, max_leaf_size_t>) {
      return (end - begin) <= stop_value_;
    } else {
      // Either stop when the depth is reached or when the amount of points that
      // remain <= 1. In the latter case it becomes impossible to split a branch
      // further. A forced split for a leaf size is 1 would just add another
      // empty node, but it would also be a problem for the
      // sliding_midpoint_max_side_t splitter rule, where none of the resulting
      // branches is allowed to be empty.
      return (depth == stop_value_) || ((end - begin) <= 1);
    }
  }